

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

void __thiscall
soplex::SPxScaler<double>::getRowUnscaled
          (SPxScaler<double> *this,SPxLPBase<double> *lp,int i,DSVectorBase<double> *vec)

{
  Item *pIVar1;
  int iVar2;
  int iVar3;
  Item *pIVar4;
  Nonzero<double> *pNVar5;
  int j;
  long lVar6;
  long lVar7;
  double local_38;
  
  iVar2 = (lp->super_LPRowSetBase<double>).scaleExp.data[i];
  pIVar4 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
  iVar3 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[i].idx;
  pIVar1 = pIVar4 + iVar3;
  DSVectorBase<double>::setMax(vec,pIVar4[iVar3].data.super_SVectorBase<double>.memused);
  (vec->super_SVectorBase<double>).memused = 0;
  lVar7 = 8;
  for (lVar6 = 0; lVar6 < (pIVar1->data).super_SVectorBase<double>.memused; lVar6 = lVar6 + 1) {
    pNVar5 = (pIVar1->data).super_SVectorBase<double>.m_elem;
    iVar3 = *(int *)((long)&pNVar5->val + lVar7);
    local_38 = ldexp(*(double *)((long)pNVar5 + lVar7 + -8),
                     -((lp->super_LPColSetBase<double>).scaleExp.data[iVar3] + iVar2));
    DSVectorBase<double>::add(vec,iVar3,&local_38);
    lVar7 = lVar7 + 0x10;
  }
  return;
}

Assistant:

void SPxScaler<R>::getRowUnscaled(const SPxLPBase<R>& lp, int i, DSVectorBase<R>& vec) const
{
   assert(lp.isScaled());
   assert(i < lp.nRows());
   assert(i >= 0);

   const DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;
   const DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;
   int exp1;
   int exp2 = rowscaleExp[i];

   const SVectorBase<R>& row = lp.rowVector(i);
   vec.setMax(row.size());
   vec.clear();

   for(int j = 0; j < row.size(); j++)
   {
      exp1 = colscaleExp[row.index(j)];
      vec.add(row.index(j), spxLdexp(row.value(j), -exp1 - exp2));
   }
}